

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O0

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>,burst::low_byte_fn,int(*)[256],int*>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      last,uchar *buffer_begin,int *param_4,size_t param_5,difference_type param_6)

{
  compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *pcVar1;
  int *counters;
  anon_class_16_2_5243436b *local_158 [2];
  compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> local_148 [12];
  uchar *local_130;
  uchar *local_128;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_120;
  uchar *local_118;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_110;
  uchar *local_100;
  uchar *local_f8;
  uchar *local_f0;
  anon_class_16_2_5243436b *local_e0 [2];
  compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> local_d0 [12];
  uchar *local_b8;
  uchar *local_b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a8;
  uchar *local_a0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_98;
  uchar *local_90;
  uchar *local_88;
  uchar *local_80;
  uchar *local_78;
  byte local_6a;
  undefined1 local_69;
  bool n1th_is_single;
  uchar *puStack_68;
  bool nth_is_single;
  uchar *local_60;
  uchar *buffer_end;
  uchar *local_50;
  long local_48;
  difference_type range_size;
  size_t radix_number_local;
  int *maximums_local;
  int (*counters_local) [256];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Stack_20;
  compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> map_local;
  uchar *buffer_begin_local;
  uchar *last_local;
  uchar *first_local;
  
  buffer_end = last._M_current;
  local_50 = first._M_current;
  range_size = param_6;
  radix_number_local = param_5;
  maximums_local = param_4;
  _Stack_20._M_current = buffer_begin;
  local_48 = std::
             distance<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                       (first,last);
  puStack_68 = _Stack_20._M_current;
  local_60 = (uchar *)std::
                      next<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                (_Stack_20,local_48);
  local_69 = *(int *)(radix_number_local + range_size * 4) == local_48;
  local_6a = *(int *)(radix_number_local + 4 + range_size * 4) == local_48;
  if ((!(bool)local_69) || (!(bool)local_6a)) {
    if ((bool)local_69) {
      local_88 = _Stack_20._M_current;
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *)range_size;
      local_80 = last._M_current;
      local_78 = first._M_current;
      local_90 = std::
                 move<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (first._M_current,last._M_current,_Stack_20._M_current);
    }
    else {
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *)range_size;
      local_a0 = first._M_current;
      local_98 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (first._M_current);
      local_b0 = last._M_current;
      local_a8 = std::
                 make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                           (last._M_current);
      local_b8 = _Stack_20._M_current;
      local_e0[0] = nth_radix<burst::low_byte_fn>(range_size);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>&>
                (local_d0,(burst *)local_e0,(anon_class_16_2_5243436b *)((long)&counters_local + 6),
                 pcVar1);
      pcVar1 = (compose_fn<burst::shift_to_unsigned_fn,_burst::identity_fn> *)
               std::begin<int,256ul>((int (*) [256])(maximums_local + range_size * 0x100));
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>>,int*>
                (local_98,local_a8,local_b8,local_d0[0],(int *)pcVar1);
    }
    if ((local_6a & 1) == 0) {
      local_118 = _Stack_20._M_current;
      local_110 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (_Stack_20._M_current);
      local_128 = local_60;
      local_120 = std::
                  make_move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                            (local_60);
      local_130 = first._M_current;
      local_158[0] = nth_radix<burst::low_byte_fn>(range_size + 1);
      compose<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>&>
                (local_148,(burst *)local_158,
                 (anon_class_16_2_5243436b *)((long)&counters_local + 6),pcVar1);
      counters = std::begin<int,256ul>((int (*) [256])(maximums_local + (range_size + 1) * 0x100));
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::identity_fn>>,int*>
                (local_110,local_120,local_130,local_148[0],counters);
    }
    else {
      local_f0 = _Stack_20._M_current;
      local_f8 = local_60;
      local_100 = first._M_current;
      std::
      move<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (_Stack_20._M_current,local_60,first._M_current);
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }